

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

base_learner * cbify_setup(options_i *options,vw *all)

{
  float fVar1;
  float fVar2;
  vw *pvVar3;
  long *plVar4;
  byte bVar5;
  pointer pcVar6;
  uint64_t uVar7;
  float *pfVar8;
  vw *in_RSI;
  int iVar9;
  long *in_RDI;
  single_learner *base_1;
  multi_learner *base;
  learner<cbify,_example> *l;
  stringstream ss_1;
  stringstream ss;
  option_group_definition new_options;
  bool use_cs;
  free_ptr<cbify> data;
  uint32_t num_actions;
  undefined4 in_stack_fffffffffffff4c8;
  float in_stack_fffffffffffff4cc;
  vw *in_stack_fffffffffffff4d0;
  string *in_stack_fffffffffffff4d8;
  typed_option<float> *in_stack_fffffffffffff4e0;
  single_learner *in_stack_fffffffffffff4e8;
  cbify *in_stack_fffffffffffff4f0;
  prediction_type_t pred_type;
  uint64_t in_stack_fffffffffffff500;
  size_t in_stack_fffffffffffff508;
  void *in_stack_fffffffffffff510;
  typed_option<float> *in_stack_fffffffffffff518;
  option_group_definition *in_stack_fffffffffffff520;
  allocator *paVar10;
  byte local_a62;
  learner<char,_char> *in_stack_fffffffffffff690;
  typed_option<float> *local_968;
  string local_960 [39];
  allocator local_939;
  string local_938 [32];
  float local_918;
  float local_914;
  stringstream local_910 [16];
  undefined1 local_900 [383];
  allocator local_781;
  string local_780 [32];
  string local_760 [39];
  allocator local_739;
  string local_738 [32];
  string local_718 [39];
  allocator local_6f1;
  string local_6f0 [32];
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [32];
  stringstream local_688 [16];
  undefined1 local_678 [383];
  allocator local_4f9;
  string local_4f8 [32];
  action_score *local_4d8;
  action_score *local_4d0;
  action_score *local_4c8;
  size_t local_4c0;
  allocator local_4b1;
  string local_4b0 [32];
  undefined4 local_490;
  allocator local_489;
  string local_488 [39];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [199];
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [199];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [199];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  typed_option<unsigned_int> local_148;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [63];
  byte local_31;
  undefined1 local_30 [20];
  uint local_1c;
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  local_1c = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<cbify>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Make Multiclass into Contextual Bandit",&local_91);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff4d0,
             (string *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"cbify",&local_169);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff4d8,(uint *)in_stack_fffffffffffff4d0)
  ;
  VW::config::typed_option<unsigned_int>::keep(&local_148,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_190,"Convert multiclass on <k> classes into a contextual bandit problem",
             &local_191);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff4d0,
             (string *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_fffffffffffff520,(typed_option<unsigned_int> *)in_stack_fffffffffffff518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"cbify_cs",&local_259);
  VW::config::make_option<bool>(in_stack_fffffffffffff4d8,(bool *)in_stack_fffffffffffff4d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_280,"consume cost-sensitive classification examples instead of multiclass",
             &local_281);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff4d0,
             (string *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff520,(typed_option<bool> *)in_stack_fffffffffffff518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"loss0",&local_349);
  std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
            ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31c8e5);
  VW::config::make_option<float>(in_stack_fffffffffffff4d8,(float *)in_stack_fffffffffffff4d0);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff4e0,(float)((ulong)in_stack_fffffffffffff4d8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"loss for correct label",&local_371);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff4d0,
             (string *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"loss1",&local_439);
  std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
            ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31c9ce);
  VW::config::make_option<float>(in_stack_fffffffffffff4d8,(float *)in_stack_fffffffffffff4d0);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff4e0,(float)((ulong)in_stack_fffffffffffff4d8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"loss for incorrect label",&local_461);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff4d0,
             (string *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  (**(code **)*local_10)(local_10,local_70);
  plVar4 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"cbify",&local_489);
  bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_488);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  plVar4 = local_10;
  if (((bVar5 ^ 0xff) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4b0,"cb_explore_adf",&local_4b1);
    bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_4b0);
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d043);
    pcVar6->use_adf = (bool)(bVar5 & 1);
    std::__cxx11::string::~string(local_4b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
    uVar7 = uniform_hash(in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                         in_stack_fffffffffffff500);
    pred_type = (prediction_type_t)in_stack_fffffffffffff500;
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d096);
    pcVar6->app_seed = uVar7;
    v_init<ACTION_SCORE::action_score>();
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d0be);
    pvVar3 = local_18;
    (pcVar6->a_s)._begin = local_4d8;
    (pcVar6->a_s)._end = local_4d0;
    (pcVar6->a_s).end_array = local_4c8;
    (pcVar6->a_s).erase_count = local_4c0;
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d10b);
    pcVar6->all = pvVar3;
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d124);
    if ((pcVar6->use_adf & 1U) != 0) {
      std::unique_ptr<cbify,_void_(*)(void_*)>::get
                ((unique_ptr<cbify,_void_(*)(void_*)> *)in_stack_fffffffffffff4d0);
      init_adf_data(in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8);
    }
    plVar4 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f8,"cb_explore",&local_4f9);
    bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_4f8);
    local_a62 = 0;
    if ((bVar5 & 1) == 0) {
      pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                         ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d21e);
      local_a62 = pcVar6->use_adf ^ 0xff;
    }
    std::__cxx11::string::~string(local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
    if ((local_a62 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_688);
      std::ostream::operator<<(local_678,local_1c);
      plVar4 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6a8,"cb_explore",&local_6a9);
      std::__cxx11::stringstream::str();
      (**(code **)(*plVar4 + 0x28))(plVar4,local_6a8,local_6d0);
      std::__cxx11::string::~string(local_6d0);
      std::__cxx11::string::~string(local_6a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
      std::__cxx11::stringstream::~stringstream(local_688);
    }
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d422);
    plVar4 = local_10;
    if ((pcVar6->use_adf & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6f0,"cb_min_cost",&local_6f1);
      std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d47c);
      std::__cxx11::to_string(in_stack_fffffffffffff4cc);
      (**(code **)(*plVar4 + 0x28))(plVar4,local_6f0,local_718);
      std::__cxx11::string::~string(local_718);
      std::__cxx11::string::~string(local_6f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
      plVar4 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_738,"cb_max_cost",&local_739);
      std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d52d);
      std::__cxx11::to_string(in_stack_fffffffffffff4cc);
      (**(code **)(*plVar4 + 0x28))(plVar4,local_738,local_760);
      std::__cxx11::string::~string(local_760);
      std::__cxx11::string::~string(local_738);
      std::allocator<char>::~allocator((allocator<char> *)&local_739);
    }
    plVar4 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_780,"baseline",&local_781);
    bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_780);
    std::__cxx11::string::~string(local_780);
    std::allocator<char>::~allocator((allocator<char> *)&local_781);
    if ((bVar5 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_910);
      iVar9 = (int)local_30;
      std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d726);
      std::abs(iVar9);
      iVar9 = (int)local_30;
      std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d75d);
      std::abs(iVar9);
      pfVar8 = std::max<float>(&local_914,&local_918);
      fVar1 = *pfVar8;
      pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                         ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d7be);
      fVar2 = pcVar6->loss1;
      pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                         ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d7d6);
      std::ostream::operator<<(local_900,fVar1 / (fVar2 - pcVar6->loss0));
      paVar10 = &local_939;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_938,"lr_multiplier",paVar10);
      std::__cxx11::stringstream::str();
      (**(code **)(*local_10 + 0x28))(local_10,local_938,local_960);
      std::__cxx11::string::~string(local_960);
      std::__cxx11::string::~string(local_938);
      std::allocator<char>::~allocator((allocator<char> *)&local_939);
      std::__cxx11::stringstream::~stringstream(local_910);
    }
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x31d990);
    if ((pcVar6->use_adf & 1U) == 0) {
      in_stack_fffffffffffff4f0 =
           (cbify *)setup_base((options_i *)in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
      in_stack_fffffffffffff4e8 = LEARNER::as_singleline<char,char>(in_stack_fffffffffffff690);
      if ((local_31 & 1) == 0) {
        local_968 = (typed_option<float> *)
                    LEARNER::init_multiclass_learner<cbify,example,LEARNER::learner<char,example>>
                              ((free_ptr<cbify> *)in_stack_fffffffffffff4f0,
                               in_stack_fffffffffffff4e8,
                               (_func_void_cbify_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff4e0,
                               (_func_void_cbify_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff4d8,(parser *)in_stack_fffffffffffff4d0,
                               CONCAT44(in_stack_fffffffffffff4cc,4),pred_type);
      }
      else {
        in_stack_fffffffffffff4e0 =
             (typed_option<float> *)
             LEARNER::init_cost_sensitive_learner<cbify,example,LEARNER::learner<char,example>>
                       ((free_ptr<cbify> *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,
                        (_func_void_cbify_ptr_learner<char,_example>_ptr_example_ptr *)
                        in_stack_fffffffffffff4e0,
                        (_func_void_cbify_ptr_learner<char,_example>_ptr_example_ptr *)
                        in_stack_fffffffffffff4d8,(parser *)in_stack_fffffffffffff4d0,
                        CONCAT44(in_stack_fffffffffffff4cc,4),pred_type);
        local_968 = in_stack_fffffffffffff4e0;
      }
    }
    else {
      setup_base((options_i *)in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
      LEARNER::as_multiline<char,char>(in_stack_fffffffffffff690);
      if ((local_31 & 1) == 0) {
        local_968 = (typed_option<float> *)
                    LEARNER::
                    init_multiclass_learner<cbify,example,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                              ((free_ptr<cbify> *)in_stack_fffffffffffff4f0,
                               (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *
                               )in_stack_fffffffffffff4e8,
                               (_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                                *)in_stack_fffffffffffff4e0,
                               (_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                                *)in_stack_fffffffffffff4d8,(parser *)in_stack_fffffffffffff4d0,
                               CONCAT44(in_stack_fffffffffffff4cc,4),pred_type);
      }
      else {
        local_968 = (typed_option<float> *)
                    LEARNER::
                    init_cost_sensitive_learner<cbify,example,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                              ((free_ptr<cbify> *)in_stack_fffffffffffff4f0,
                               (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *
                               )in_stack_fffffffffffff4e8,
                               (_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                                *)in_stack_fffffffffffff4e0,
                               (_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                                *)in_stack_fffffffffffff4d8,(parser *)in_stack_fffffffffffff4d0,
                               CONCAT44(in_stack_fffffffffffff4cc,4),pred_type);
      }
    }
    LEARNER::learner<cbify,_example>::set_finish
              ((learner<cbify,_example> *)in_stack_fffffffffffff4f0,
               (_func_void_cbify_ptr *)in_stack_fffffffffffff4e8);
    local_18->delete_prediction = (_func_void_void_ptr *)0x0;
    in_stack_fffffffffffff4d0 =
         (vw *)LEARNER::make_base<cbify,example>((learner<cbify,_example> *)local_968);
    local_8 = in_stack_fffffffffffff4d0;
  }
  else {
    local_8 = (vw *)0x0;
  }
  local_490 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff4d0);
  std::unique_ptr<cbify,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<cbify,_void_(*)(void_*)> *)in_stack_fffffffffffff4e0);
  return (base_learner *)local_8;
}

Assistant:

base_learner* cbify_setup(options_i& options, vw& all)
{
  uint32_t num_actions = 0;
  auto data = scoped_calloc_or_throw<cbify>();
  bool use_cs;

  option_group_definition new_options("Make Multiclass into Contextual Bandit");
  new_options
      .add(make_option("cbify", num_actions)
               .keep()
               .help("Convert multiclass on <k> classes into a contextual bandit problem"))
      .add(make_option("cbify_cs", use_cs).help("consume cost-sensitive classification examples instead of multiclass"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cbify"))
    return nullptr;

  data->use_adf = options.was_supplied("cb_explore_adf");
  data->app_seed = uniform_hash("vw", 2, 0);
  data->a_s = v_init<action_score>();
  data->all = &all;

  if (data->use_adf)
    init_adf_data(*data.get(), num_actions);

  if (!options.was_supplied("cb_explore") && !data->use_adf)
  {
    stringstream ss;
    ss << num_actions;
    options.insert("cb_explore", ss.str());
  }

  if (data->use_adf)
  {
    options.insert("cb_min_cost", to_string(data->loss0));
    options.insert("cb_max_cost", to_string(data->loss1));
  }

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  learner<cbify, example>* l;

  if (data->use_adf)
  {
    multi_learner* base = as_multiline(setup_base(options, all));
    if (use_cs)
      l = &init_cost_sensitive_learner(
          data, base, predict_or_learn_adf<true, true>, predict_or_learn_adf<false, true>, all.p, 1);
    else
      l = &init_multiclass_learner(
          data, base, predict_or_learn_adf<true, false>, predict_or_learn_adf<false, false>, all.p, 1);
  }
  else
  {
    single_learner* base = as_singleline(setup_base(options, all));
    if (use_cs)
      l = &init_cost_sensitive_learner(
          data, base, predict_or_learn<true, true>, predict_or_learn<false, true>, all.p, 1);
    else
      l = &init_multiclass_learner(data, base, predict_or_learn<true, false>, predict_or_learn<false, false>, all.p, 1);
  }
  l->set_finish(finish);
  all.delete_prediction = nullptr;

  return make_base(*l);
}